

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_multipivot.cpp
# Opt level: O2

void multikey_multipivot<unsigned_int,32u>(uchar **strings,size_t n,size_t depth)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  size_t n_00;
  size_t n_01;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint32_t uVar12;
  void *__src;
  byte bVar13;
  uint i_1;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  unsigned_long uVar18;
  uint j;
  long lVar19;
  unsigned_long *__memptr;
  byte *pbVar20;
  long lVar21;
  byte *__ptr;
  size_t i_2;
  byte *pbVar22;
  int iVar23;
  uchar **ppuVar24;
  uint j_2;
  double dVar25;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  undefined1 auVar26 [16];
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  char local_338;
  uint uStack_330;
  uint uStack_32c;
  byte local_328;
  byte bStack_324;
  byte bStack_320;
  byte bStack_31c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sample_array;
  undefined8 local_2f8;
  uint uStack_2f0;
  uint uStack_2ec;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> sample;
  array<unsigned_int,_32UL> pivots;
  array<unsigned_long,_65UL> bucketsize;
  
  if (n < 15000) {
    mkqsort(strings,(int)n,(int)depth);
    return;
  }
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sample._M_t._M_impl.super__Rb_tree_header._M_header;
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sample._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar21 = n - 7;
  auVar26._8_4_ = (int)((ulong)lVar21 >> 0x20);
  auVar26._0_8_ = lVar21;
  auVar26._12_4_ = 0x45300000;
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sample._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (iVar23 = 0; iVar23 != 0x20; iVar23 = iVar23 + 1) {
    dVar25 = drand48();
    dVar25 = dVar25 * ((auVar26._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0));
    uVar14 = (ulong)dVar25;
    uVar14 = (long)(dVar25 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14;
    if (n <= uVar14 + 6) {
      __assert_fail("pos+6 < n",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                    ,0x180,
                    "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned int, Pivots = 32U]"
                   );
    }
    for (lVar19 = 0; lVar19 != 7; lVar19 = lVar19 + 1) {
      uVar12 = get_char<unsigned_int>(strings[uVar14 + lVar19],depth);
      *(uint32_t *)((long)bucketsize._M_elems + lVar19 * 4) = uVar12;
    }
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_range_unique<unsigned_int*>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&sample,(uint *)&bucketsize,(uint *)((long)bucketsize._M_elems + 0x1c));
  }
  bucketsize._M_elems[0]._0_4_ = 1;
  while (sample._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x20) {
    if ((char)(uint)bucketsize._M_elems[0] == '\0') {
      bucketsize._M_elems[0]._0_4_ = (uint)bucketsize._M_elems[0] | 1;
    }
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&sample,(uint *)&bucketsize);
    bucketsize._M_elems[0]._0_4_ = (uint)bucketsize._M_elems[0] + 1;
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&sample_array,
             (_Rb_tree_const_iterator<unsigned_int>)
             sample._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_int>)&sample._M_t._M_impl.super__Rb_tree_header,
             (allocator_type *)&bucketsize);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&sample._M_t);
  uVar14 = (ulong)((long)sample_array.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)sample_array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 7;
  if ((int)uVar14 == 0) {
    __assert_fail("step > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                  ,0x191,
                  "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned int, Pivots = 32U]"
                 );
  }
  uVar17 = 0;
  for (lVar21 = 0; lVar21 != 0x20; lVar21 = lVar21 + 1) {
    pivots._M_elems[lVar21] =
         sample_array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar17 & 0xffffffff];
    uVar17 = uVar17 + uVar14;
  }
  __memptr = bucketsize._M_elems;
  iVar23 = posix_memalign((void **)__memptr,0x10,n);
  __ptr = (byte *)CONCAT44(bucketsize._M_elems[0]._4_4_,(uint)bucketsize._M_elems[0]);
  for (lVar21 = 0; uVar2 = bucketsize._M_elems[0]._4_4_, uVar1 = (uint)bucketsize._M_elems[0],
      lVar21 != 0x20; lVar21 = lVar21 + 1) {
    uVar1 = pivots._M_elems[lVar21];
    for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
      *(uint *)((long)__memptr + lVar19 * 4) = uVar1 ^ 0x80000000;
    }
    __memptr = __memptr + 2;
  }
  pbVar22 = (byte *)0x0;
  if (iVar23 != 0) {
    __ptr = pbVar22;
  }
  pbVar20 = (byte *)(n & 0xfffffffffffffff0);
  ppuVar24 = strings;
  for (; pbVar22 < pbVar20; pbVar22 = pbVar22 + 4) {
    for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
      uVar12 = get_char<unsigned_int>(ppuVar24[lVar21],depth);
      *(uint32_t *)((long)&local_2f8 + lVar21 * 4) = uVar12;
    }
    uVar30 = (uint)local_2f8 ^ 0x80000000;
    uVar31 = local_2f8._4_4_ ^ 0x80000000;
    uVar32 = uStack_2f0 ^ 0x80000000;
    uVar33 = uStack_2ec ^ 0x80000000;
    bVar37 = 0;
    bVar39 = 0;
    bVar41 = 0;
    bVar43 = 0;
    lVar21 = 0x10;
    uStack_330 = (uint)bucketsize._M_elems[1];
    uStack_32c = (uint)(bucketsize._M_elems[1] >> 0x20);
    bVar13 = 1;
    bVar27 = 1;
    bVar28 = 1;
    bVar29 = 1;
    uVar34 = uVar1;
    uVar35 = uVar2;
    while( true ) {
      bVar4 = uVar30 == uVar34;
      bVar5 = uVar31 == uVar35;
      bVar6 = uVar32 == uStack_330;
      bVar7 = uVar33 == uStack_32c;
      bVar44 = bVar13 + 1;
      bVar45 = bVar27 + 1;
      bVar46 = bVar28 + 1;
      bVar47 = bVar29 + 1;
      bVar8 = (int)uVar34 < (int)uVar30;
      bVar9 = (int)uVar35 < (int)uVar31;
      bVar10 = (int)uStack_330 < (int)uVar32;
      bVar11 = (int)uStack_32c < (int)uVar33;
      if (lVar21 == 0x200) break;
      uVar34 = *(uint *)((long)bucketsize._M_elems + lVar21);
      uVar35 = *(uint *)((long)bucketsize._M_elems + lVar21 + 4);
      uStack_330 = *(uint *)((long)bucketsize._M_elems + lVar21 + 8);
      uStack_32c = *(uint *)((long)bucketsize._M_elems + lVar21 + 0xc);
      bVar36 = -bVar4 & bVar13;
      bVar38 = -bVar5 & bVar27;
      bVar40 = -bVar6 & bVar28;
      bVar42 = -bVar7 & bVar29;
      bVar13 = bVar13 + 2;
      bVar27 = bVar27 + 2;
      bVar28 = bVar28 + 2;
      bVar29 = bVar29 + 2;
      bVar37 = bVar36 | bVar37 | -bVar8 & bVar44 & -((int)uVar30 < (int)uVar34);
      bVar39 = bVar38 | bVar39 | -bVar9 & bVar45 & -((int)uVar31 < (int)uVar35);
      bVar41 = bVar40 | bVar41 | -bVar10 & bVar46 & -((int)uVar32 < (int)uStack_330);
      bVar43 = bVar42 | bVar43 | -bVar11 & bVar47 & -((int)uVar33 < (int)uStack_32c);
      lVar21 = lVar21 + 0x10;
    }
    local_328 = bVar13 & -bVar4 | bVar37 | -bVar8 & bVar44;
    bStack_324 = bVar27 & -bVar5 | bVar39 | -bVar9 & bVar45;
    bStack_320 = bVar28 & -bVar6 | bVar41 | -bVar10 & bVar46;
    bStack_31c = bVar29 & -bVar7 | bVar43 | -bVar11 & bVar47;
    __ptr[(long)pbVar22] = local_328;
    (__ptr + 1)[(long)pbVar22] = bStack_324;
    (__ptr + 2)[(long)pbVar22] = bStack_320;
    (__ptr + 3)[(long)pbVar22] = bStack_31c;
    ppuVar24 = ppuVar24 + 4;
  }
  do {
    if (n <= pbVar20) {
      local_2f8 = 0;
      std::array<unsigned_long,_65UL>::fill(&bucketsize,&local_2f8);
      bVar13 = *__ptr;
      bucketsize._M_elems[bVar13] = bucketsize._M_elems[bVar13] + 1;
      uVar17 = (ulong)bVar13;
      for (uVar14 = 1;
          (uVar15 = n, n != uVar14 &&
          (bVar13 = __ptr[uVar14], uVar15 = uVar14, (byte)uVar17 <= bVar13)); uVar14 = uVar14 + 1) {
        bucketsize._M_elems[bVar13] = bucketsize._M_elems[bVar13] + 1;
        uVar17 = (ulong)bVar13;
      }
      for (; uVar15 < n; uVar15 = uVar15 + 1) {
        bucketsize._M_elems[__ptr[uVar15]] = bucketsize._M_elems[__ptr[uVar15]] + 1;
      }
      if (uVar14 < n) {
        __src = malloc(n * 8);
        multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[0] = 0;
        uVar18 = 0;
        for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 1) {
          uVar18 = uVar18 + bucketsize._M_elems[lVar21];
          multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[lVar21 + 1] = uVar18;
        }
        for (sVar16 = 0; n != sVar16; sVar16 = sVar16 + 1) {
          puVar3 = strings[sVar16];
          uVar18 = multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[__ptr[sVar16]];
          multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[__ptr[sVar16]] = uVar18 + 1;
          *(uchar **)((long)__src + uVar18 * 8) = puVar3;
        }
        memcpy(strings,__src,n * 8);
        free(__src);
      }
      free(__ptr);
      sVar16 = CONCAT44(bucketsize._M_elems[0]._4_4_,(uint)bucketsize._M_elems[0]);
      if (sVar16 != 0) {
        multikey_multipivot<unsigned_int,32u>(strings,sVar16,depth);
      }
      lVar21 = 0;
      do {
        if (lVar21 == 0x1f) {
          if (bucketsize._M_elems[0x3f] != 0) {
            local_338 = (char)pivots._M_elems[0x1f];
            if (local_338 != '\0') {
              multikey_multipivot<unsigned_int,32u>
                        (strings + sVar16,bucketsize._M_elems[0x3f],depth + 4);
            }
            sVar16 = sVar16 + bucketsize._M_elems[0x3f];
          }
          if (bucketsize._M_elems[0x40] != 0) {
            multikey_multipivot<unsigned_int,32u>(strings + sVar16,bucketsize._M_elems[0x40],depth);
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&sample_array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&sample._M_t);
          return;
        }
        n_00 = bucketsize._M_elems[lVar21 * 2 + 1];
        if ((n_00 != 0) && ((char)pivots._M_elems[lVar21] != '\0')) {
          multikey_multipivot<unsigned_int,32u>(strings + sVar16,n_00,depth + 4);
        }
        n_01 = bucketsize._M_elems[lVar21 * 2 + 2];
        if (n_01 != 0) {
          uVar1 = pivots._M_elems[lVar21];
          uVar2 = pivots._M_elems[lVar21 + 1];
          if (uVar1 == uVar2) {
            __assert_fail("a != b",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                          ,0x60,"unsigned int lcp(uint32_t, uint32_t)");
          }
          if ((uVar1 & 0xff000000) == (uVar2 & 0xff000000) && (uVar1 & 0xff000000) != 0) {
            uVar14 = 1;
            if ((uVar1 & 0xff0000) == (uVar2 & 0xff0000) && (uVar1 & 0xff0000) != 0) {
              uVar14 = (ulong)((uVar1 & 0xff00) == (uVar2 & 0xff00) && (uVar1 & 0xff00) != 0) | 2;
            }
          }
          else {
            uVar14 = 0;
          }
          multikey_multipivot<unsigned_int,32u>(strings + n_00 + sVar16,n_01,uVar14 + depth);
        }
        lVar21 = lVar21 + 1;
        sVar16 = n_01 + n_00 + sVar16;
      } while( true );
    }
    uVar12 = get_char<unsigned_int>(strings[(long)pbVar20],depth);
    if (uVar12 < pivots._M_elems[0]) {
      __ptr[(long)pbVar20] = 0;
    }
    else {
      bVar13 = 1;
      for (lVar21 = 2; lVar21 != 0x40; lVar21 = lVar21 + 2) {
        uVar1 = *(uint *)((long)pivots._M_elems + lVar21 * 2 + -4);
        if (uVar12 == uVar1) {
          __ptr[(long)pbVar20] = bVar13;
          goto LAB_001b5f38;
        }
        if ((uVar1 < uVar12) && (uVar12 < *(uint *)((long)pivots._M_elems + lVar21 * 2))) {
          __ptr[(long)pbVar20] = (byte)lVar21;
          goto LAB_001b5f38;
        }
        bVar13 = bVar13 + 2;
      }
      if (uVar12 == pivots._M_elems[0x1f]) {
        __ptr[(long)pbVar20] = 0x3f;
      }
      else {
        __ptr[(long)pbVar20] = 0x40;
      }
    }
LAB_001b5f38:
    pbVar20 = pbVar20 + 1;
  } while( true );
}

Assistant:

static void
multikey_multipivot(unsigned char** strings, size_t n, size_t depth)
{
	static_assert(Pivots > 0, "Pivots must be non-zero");
	static_assert(total_buckets(Pivots) < 0x100, "total number of bucket must be max 255");
	if (n < 15000) {
		mkqsort(strings, n, depth);
		return;
	}
	// TODO: collect frequencies to gain knowledge about distribution
	std::set<CharT> sample;
	for (unsigned i=0; i < Pivots; ++i) {
		double r=drand48();
		size_t pos = ((size_t)((n-7)*r));
		assert(pos+6 < n);
		std::array<CharT, 7> tmp;
		for (unsigned j=0;j<tmp.size();++j) {
			tmp[j] = get_char<CharT>(strings[pos+j], depth);
		}
		sample.insert(tmp.begin(), tmp.end());
	}
	// We _must_ select enough pivots -> insert junk.
	for (CharT i=1; sample.size() < Pivots; ++i) {
		if (is_end(i)) ++i;
		sample.insert(i);
	}
	// Pick pivots from the sample.
	std::vector<CharT> sample_array(sample.begin(), sample.end());
	sample.clear();
	std::array<CharT, Pivots> pivots;
	unsigned step = sample_array.size() / Pivots;
	assert(step > 0);
	for (unsigned i=0; i < Pivots; ++i) {
		pivots[i] = sample_array[step*i];
	}
	uint8_t* restrict oracle = static_cast<uint8_t*>(_mm_malloc(n, 16));
	fill_oracle<Pivots>(strings, n, oracle, pivots, depth);
	std::array<size_t, total_buckets(Pivots)> bucketsize;
	bucketsize.fill(0);
	uint8_t prev = oracle[0];
	bool sorted = true;
	size_t i=1;
	++bucketsize[prev];
	for (; i < n; ++i) {
		uint8_t bucket = oracle[i];
		if (prev > bucket) {
			sorted = false; break;
		}
		++bucketsize[bucket];
		prev = bucket;
	}
	for (; i < n; ++i)
		++bucketsize[oracle[i]];
	if (not sorted) {
		unsigned char** sorted = (unsigned char**)
			malloc(n*sizeof(unsigned char*));
		static std::array<size_t, total_buckets(Pivots)> bucketindex;
		bucketindex[0] = 0;
		for (unsigned i=1; i < total_buckets(Pivots); ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < n; ++i)
			sorted[bucketindex[oracle[i]]++] = strings[i];
		memcpy(strings, sorted, n*sizeof(unsigned char*));
		free(sorted);
	}
	_mm_free(oracle);
	size_t b=0;
	size_t bsum = bucketsize[0];
	if (bsum) multikey_multipivot<CharT, Pivots>(strings, bsum, depth);
	for (unsigned i=0; i < Pivots-1; ++i) {
		b = bucketsize[middle_bucket(i)];
		if (b and not is_end(pivots[i])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
					depth+sizeof(CharT));
		}
		bsum += b;
		if ((b = bucketsize[right_bucket(i)])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
				depth+lcp(pivots[i], pivots[i+1]));
		}
		bsum += b;
	}
	if ((b = bucketsize[middle_bucket(Pivots-1)])) {
		if (not is_end(pivots[Pivots-1]))
			multikey_multipivot<CharT, Pivots>(strings+bsum,
				b, depth+sizeof(CharT));
		bsum += b;
	}
	if ((b = bucketsize[right_bucket(Pivots-1)])) {
		multikey_multipivot<CharT, Pivots>(strings+bsum, b, depth);
	}
}